

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

RadialGradientShape __thiscall
Rml::DecoratorRadialGradient::CalculateRadialGradientShape
          (DecoratorRadialGradient *this,Element *element,Vector2f dimensions)

{
  Shape SVar1;
  Vector2f a;
  Vector2f a_00;
  Vector2f v;
  Vector2f a_01;
  Vector2f a_02;
  Vector2f a_03;
  Vector2f VVar2;
  Vector2f b;
  Vector2f b_00;
  Vector2f b_01;
  Vector2f b_02;
  undefined4 base_value;
  Element *pEVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  float fVar6;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  RadialGradientShape RVar7;
  Vector2<float> local_60;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  float local_38;
  undefined4 uStack_34;
  float local_28;
  float fStack_24;
  undefined4 uStack_20;
  
  local_58._4_4_ = dimensions.y;
  local_58._0_4_ = local_58._4_4_;
  fStack_50 = (float)local_58._4_4_;
  fStack_4c = (float)local_58._4_4_;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = dimensions;
  local_48._12_4_ = in_XMM0_Dd;
  local_38 = Element::ResolveNumericValue(element,(this->position).x,dimensions.x);
  pEVar3 = element;
  uStack_34 = extraout_XMM0_Db;
  fStack_24 = Element::ResolveNumericValue(element,(this->position).y,(float)local_58._0_4_);
  SVar1 = this->shape;
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_28 = local_38;
  uStack_20 = uStack_34;
  switch(this->size_type) {
  case ClosestSide:
    a_02.y = fStack_24;
    a_02.x = local_38;
    b_02.y = (float)local_48._4_4_ - fStack_24;
    b_02.x = (float)local_48._0_4_ - local_38;
    VVar2 = Math::Min<Rml::Vector2<float>>(a_02,b_02);
    local_60 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pEVar3,VVar2);
    fVar5 = local_60.x;
    fVar6 = local_60.y;
    fVar4 = fVar6;
    if ((SVar1 == Circle) && (fVar4 = fVar5, fVar6 <= fVar5)) {
      fVar5 = fVar6;
      fVar4 = fVar6;
    }
    break;
  case FarthestSide:
    a_01.y = fStack_24;
    a_01.x = local_38;
    b_01.y = (float)local_48._4_4_ - fStack_24;
    b_01.x = (float)local_48._0_4_ - local_38;
    VVar2 = Math::Max<Rml::Vector2<float>>(a_01,b_01);
    local_60 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pEVar3,VVar2);
    fVar5 = local_60.x;
    fVar6 = local_60.y;
    fVar4 = fVar6;
    if ((SVar1 == Circle) && (fVar4 = fVar5, fVar5 <= fVar6)) {
      fVar5 = fVar6;
      fVar4 = fVar6;
    }
    break;
  case ClosestCorner:
    a_00.y = fStack_24;
    a_00.x = local_38;
    b_00.y = (float)local_48._4_4_ - fStack_24;
    b_00.x = (float)local_48._0_4_ - local_38;
    VVar2 = Math::Min<Rml::Vector2<float>>(a_00,b_00);
    fVar5 = VVar2.x;
    fVar4 = VVar2.y;
    goto LAB_0027377f;
  case FarthestCorner:
    a.y = fStack_24;
    a.x = local_38;
    b.y = (float)local_48._4_4_ - fStack_24;
    b.x = (float)local_48._0_4_ - local_38;
    VVar2 = Math::Max<Rml::Vector2<float>>(a,b);
    fVar5 = VVar2.x;
    fVar4 = VVar2.y;
LAB_0027377f:
    v.y = fVar4;
    v.x = fVar5;
    local_60 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pEVar3,v);
    if (SVar1 == Circle) {
      fVar5 = Vector2<float>::Magnitude(&local_60);
      fVar4 = fVar5;
    }
    else {
      local_60 = Math::Max<Rml::Vector2<float>>(local_60,(Vector2f)0x3f8000003f800000);
      fVar5 = local_60.x;
      fStack_50 = (float)extraout_XMM0_Dc_00;
      local_58._0_4_ = local_60.x;
      local_58._4_4_ = local_60.y;
      fStack_4c = (float)extraout_XMM0_Dd_00;
      fVar5 = Math::SquareRoot((fVar5 + fVar5) * fVar5);
      fVar4 = ((float)local_58._4_4_ / (float)local_58._0_4_) * fVar5;
    }
    break;
  case LengthPercentage:
    pEVar3 = element;
    fVar4 = Element::ResolveNumericValue(element,(this->size).x,(float)local_48._0_4_);
    fVar5 = fVar4;
    if (SVar1 != Circle) {
      base_value = local_58._0_4_;
      local_58._4_4_ = extraout_XMM0_Db_00;
      local_58._0_4_ = fVar4;
      fStack_50 = (float)extraout_XMM0_Dc;
      fStack_4c = (float)extraout_XMM0_Dd;
      fVar4 = Element::ResolveNumericValue(element,(this->size).y,(float)base_value);
      pEVar3 = element;
      fVar5 = (float)local_58._0_4_;
    }
    VVar2.y = fVar4;
    VVar2.x = fVar5;
    VVar2 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pEVar3,VVar2);
    fVar5 = VVar2.x;
    fVar4 = VVar2.y;
    break;
  default:
    fVar5 = 0.0;
    fVar4 = 0.0;
  }
  a_03.y = fVar4;
  a_03.x = fVar5;
  VVar2 = Math::Max<Rml::Vector2<float>>(a_03,(Vector2f)0x3f8000003f800000);
  RVar7.center.y = fStack_24;
  RVar7.center.x = local_28;
  RVar7.radius = VVar2;
  return RVar7;
}

Assistant:

DecoratorRadialGradient::RadialGradientShape DecoratorRadialGradient::CalculateRadialGradientShape(Element* element, Vector2f dimensions) const
{
	RadialGradientShape result;
	result.center.x = element->ResolveNumericValue(position.x, dimensions.x);
	result.center.y = element->ResolveNumericValue(position.y, dimensions.y);
	const bool is_circle = (shape == Shape::Circle);

	auto Abs = [](Vector2f v) { return Vector2f{Math::Absolute(v.x), Math::Absolute(v.y)}; };
	auto d = dimensions;
	auto c = result.center;
	Vector2f r;

	switch (size_type)
	{
	case SizeType::ClosestSide:
	{
		r = Abs(Math::Min(c, d - c));
		result.radius = (is_circle ? Vector2f(Math::Min(r.x, r.y)) : r);
	}
	break;
	case SizeType::FarthestSide:
	{
		r = Abs(Math::Max(c, d - c));
		result.radius = (is_circle ? Vector2f(Math::Max(r.x, r.y)) : r);
	}
	break;
	case SizeType::ClosestCorner:
	case SizeType::FarthestCorner:
	{
		if (size_type == SizeType::ClosestCorner)
			r = Abs(Math::Min(c, d - c)); // Same as closest-side.
		else
			r = Abs(Math::Max(c, d - c)); // Same as farthest-side.

		if (is_circle)
		{
			result.radius = Vector2f(r.Magnitude());
		}
		else
		{
			r = Math::Max(r, Vector2f(1)); // In case r.x ~= 0
			result.radius.x = Math::SquareRoot(2.f * r.x * r.x);
			result.radius.y = result.radius.x * (r.y / r.x);
		}
	}
	break;
	case SizeType::LengthPercentage:
	{
		result.radius.x = element->ResolveNumericValue(size.x, d.x);
		result.radius.y = (is_circle ? result.radius.x : element->ResolveNumericValue(size.y, d.y));
		result.radius = Abs(result.radius);
	}
	break;
	}

	result.radius = Math::Max(result.radius, Vector2f(1.f));
	return result;
}